

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

void __thiscall google::protobuf::compiler::python::Generator::PrintTopBoilerplate(Generator *this)

{
  string *psVar1;
  Printer *this_00;
  Version *pVVar2;
  AlphaNum *a;
  AlphaNum *a_00;
  AlphaNum *a_01;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  char *local_138;
  string local_130;
  string local_110;
  string local_f0;
  basic_string_view<char,_std::char_traits<char>_> local_d0;
  AlphaNum local_c0;
  AlphaNum local_90;
  AlphaNum local_60;
  
  psVar1 = this->file_->name_;
  local_c0.piece_._M_str = (psVar1->_M_dataplus)._M_p;
  local_c0.piece_._M_len = psVar1->_M_string_length;
  text._M_str = 
  "# -*- coding: utf-8 -*-\n# Generated by the protocol buffer compiler.  DO NOT EDIT!\n# NO CHECKED-IN PROTOBUF GENCODE\n# source: $filename$\n"
  ;
  text._M_len = 0x89;
  io::Printer::Print<char[9],std::basic_string_view<char,std::char_traits<char>>>
            (this->printer_,text,(char (*) [9])"filename",&local_c0.piece_);
  if (this->opensource_runtime_ == true) {
    text_00._M_str = "# Protobuf Python Version: $protobuf_python_version$\n";
    text_00._M_len = 0x35;
    io::Printer::Print<char[24],char[11]>
              (this->printer_,text_00,(char (*) [24])"protobuf_python_version",
               (char (*) [11])"6.31.0-dev");
  }
  text_01._M_str = "\"\"\"Generated protocol buffer code.\"\"\"\n";
  text_01._M_len = 0x26;
  io::Printer::Print<>(this->printer_,text_01);
  local_c0.piece_._M_len = 0x478169;
  text_02._M_str =
       "from google.protobuf import descriptor as _descriptor\nfrom google.protobuf import descriptor_pool as _descriptor_pool\n$runtime_version_import$from google.protobuf import symbol_database as _symbol_database\nfrom google.protobuf.internal import builder as _builder\n"
  ;
  text_02._M_len = 0x107;
  io::Printer::Print<char[23],char_const*>
            (this->printer_,text_02,(char (*) [23])"runtime_version_import",(char **)&local_c0);
  pVVar2 = GetProtobufPythonVersion(this->opensource_runtime_);
  this_00 = this->printer_;
  local_138 = "_runtime_version.Domain.GOOGLE_INTERNAL";
  if (this->opensource_runtime_ != false) {
    local_138 = "_runtime_version.Domain.PUBLIC";
  }
  absl::lts_20250127::AlphaNum::AlphaNum(&local_c0,(pVVar2->field_0)._impl_.major_);
  absl::lts_20250127::StrCat_abi_cxx11_(&local_110,(lts_20250127 *)&local_c0,a);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_60,(pVVar2->field_0)._impl_.minor_);
  absl::lts_20250127::StrCat_abi_cxx11_(&local_130,(lts_20250127 *)&local_60,a_00);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_90,(pVVar2->field_0)._impl_.patch_);
  absl::lts_20250127::StrCat_abi_cxx11_(&local_f0,(lts_20250127 *)&local_90,a_01);
  psVar1 = this->file_->name_;
  local_d0._M_str = (psVar1->_M_dataplus)._M_p;
  local_d0._M_len = psVar1->_M_string_length;
  text_03._M_str =
       "_runtime_version.ValidateProtobufRuntimeVersion(\n    $domain$,\n    $major$,\n    $minor$,\n    $patch$,\n    \'$suffix$\',\n    \'$location$\'\n)\n"
  ;
  text_03._M_len = 0x89;
  io::Printer::
  Print<char[7],char_const*,char[6],std::__cxx11::string,char[6],std::__cxx11::string,char[6],std::__cxx11::string,char[7],std::__cxx11::string,char[9],std::basic_string_view<char,std::char_traits<char>>>
            (this_00,text_03,(char (*) [7])"domain",&local_138,(char (*) [6])"major",&local_110,
             (char (*) [6])"minor",&local_130,(char (*) [6])"patch",&local_f0,(char (*) [7])0x4773ba
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((ulong)(pVVar2->field_0)._impl_.suffix_.tagged_ptr_.ptr_ & 0xfffffffffffffffc),
             (char (*) [9])0x4dba77,&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  text_04._M_str = "# @@protoc_insertion_point(imports)\n\n";
  text_04._M_len = 0x25;
  io::Printer::Print<>(this->printer_,text_04);
  text_05._M_str = "_sym_db = _symbol_database.Default()\n";
  text_05._M_len = 0x25;
  io::Printer::Print<>(this->printer_,text_05);
  text_06._M_str = "\n\n";
  text_06._M_len = 2;
  io::Printer::Print<>(this->printer_,text_06);
  return;
}

Assistant:

void Generator::PrintTopBoilerplate() const {
  // TODO: Allow parameterization of Python version?
  printer_->Print(
      "# -*- coding: utf-8 -*-\n"
      "# Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
      "# NO CHECKED-IN PROTOBUF "
      // Intentional line breaker
      "GENCODE\n"
      "# source: $filename$\n",
      "filename", file_->name());
  if (opensource_runtime_) {
    printer_->Print("# Protobuf Python Version: $protobuf_python_version$\n",
                    "protobuf_python_version", PROTOBUF_PYTHON_VERSION_STRING);
  }
  printer_->Print("\"\"\"Generated protocol buffer code.\"\"\"\n");
  bool runtime_version_disabled = false;
  printer_->Print(
      "from google.protobuf import descriptor as _descriptor\n"
      "from google.protobuf import descriptor_pool as _descriptor_pool\n"
      "$runtime_version_import$"
      "from google.protobuf import symbol_database as _symbol_database\n"
      "from google.protobuf.internal import builder as _builder\n",
      "runtime_version_import",
      runtime_version_disabled ? ""
                               : "from google.protobuf import runtime_version "
                                 "as _runtime_version\n");
  if (!runtime_version_disabled) {
    const auto& version = GetProtobufPythonVersion(opensource_runtime_);
    printer_->Print(
        "_runtime_version.ValidateProtobufRuntimeVersion(\n"
        "    $domain$,\n"
        "    $major$,\n"
        "    $minor$,\n"
        "    $patch$,\n"
        "    '$suffix$',\n"
        "    '$location$'\n"
        ")\n",
        "domain",
        opensource_runtime_ ? "_runtime_version.Domain.PUBLIC"
                            : "_runtime_version.Domain.GOOGLE_INTERNAL",
        "major", absl::StrCat(version.major()), "minor",
        absl::StrCat(version.minor()), "patch", absl::StrCat(version.patch()),
        "suffix", version.suffix(), "location", file_->name());
  }
  printer_->Print("# @@protoc_insertion_point(imports)\n\n");
  printer_->Print("_sym_db = _symbol_database.Default()\n");
  printer_->Print("\n\n");
}